

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::CopyPropagateArrays::HasNoStores(CopyPropagateArrays *this,Instruction *ptr_inst)

{
  Instruction *def;
  bool bVar1;
  DefUseManager *this_00;
  anon_class_8_1_8991fb9c local_40;
  function<bool_(spvtools::opt::Instruction_*)> local_38;
  Instruction *local_18;
  Instruction *ptr_inst_local;
  CopyPropagateArrays *this_local;
  
  local_18 = ptr_inst;
  ptr_inst_local = (Instruction *)this;
  this_00 = Pass::get_def_use_mgr((Pass *)this);
  def = local_18;
  local_40.this = this;
  std::function<bool(spvtools::opt::Instruction*)>::
  function<spvtools::opt::CopyPropagateArrays::HasNoStores(spvtools::opt::Instruction*)::__0,void>
            ((function<bool(spvtools::opt::Instruction*)> *)&local_38,&local_40);
  bVar1 = analysis::DefUseManager::WhileEachUser(this_00,def,&local_38);
  std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_38);
  return bVar1;
}

Assistant:

bool CopyPropagateArrays::HasNoStores(Instruction* ptr_inst) {
  return get_def_use_mgr()->WhileEachUser(ptr_inst, [this](Instruction* use) {
    if (use->opcode() == spv::Op::OpLoad) {
      return true;
    } else if (use->opcode() == spv::Op::OpAccessChain) {
      return HasNoStores(use);
    } else if (use->IsDecoration() || use->opcode() == spv::Op::OpName) {
      return true;
    } else if (use->opcode() == spv::Op::OpStore) {
      return false;
    } else if (use->opcode() == spv::Op::OpImageTexelPointer) {
      return true;
    } else if (use->opcode() == spv::Op::OpEntryPoint) {
      return true;
    } else if (IsInterpolationInstruction(use)) {
      return true;
    }
    // Some other instruction.  Be conservative.
    return false;
  });
}